

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O2

int mdb_drop(MDB_txn *txn,MDB_dbi dbi,int del)

{
  undefined8 *puVar1;
  MDB_db *pMVar2;
  int iVar3;
  int iVar4;
  MDB_cursor *pMVar5;
  MDB_cursor *mc;
  
  iVar3 = 0x16;
  if (((txn != (MDB_txn *)0x0 && (uint)del < 2) && (dbi < txn->mt_numdbs)) &&
     ((txn->mt_dbflags[dbi] & 0x10) != 0)) {
    if ((txn->mt_flags & 0x20000) == 0) {
      iVar3 = -0x783c;
      if (txn->mt_dbiseqs[dbi] == txn->mt_env->me_dbiseqs[dbi]) {
        iVar3 = mdb_cursor_open(txn,dbi,&mc);
        if (iVar3 == 0) {
          iVar3 = mdb_drop0(mc,mc->mc_db->md_flags & 4);
          pMVar5 = (MDB_cursor *)(txn->mt_cursors + dbi);
          while (pMVar5 = pMVar5->mc_next, pMVar5 != (MDB_cursor *)0x0) {
            *(byte *)&pMVar5->mc_flags = (byte)pMVar5->mc_flags & 0xfc;
          }
          if (iVar3 == 0) {
            if (dbi < 2 || del == 0) {
              txn->mt_dbflags[dbi] = txn->mt_dbflags[dbi] | 1;
              pMVar2 = txn->mt_dbs;
              puVar1 = (undefined8 *)((long)&pMVar2[dbi].md_leaf_pages + 6);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined2 *)((long)&pMVar2[dbi].md_entries + 6) = 0;
              *(undefined8 *)&pMVar2[dbi].md_depth = 0;
              *(undefined8 *)(&pMVar2[dbi].md_depth + 4) = 0;
              pMVar2[dbi].md_root = 0xffffffffffffffff;
              *(byte *)&txn->mt_flags = (byte)txn->mt_flags | 4;
              iVar3 = 0;
            }
            else {
              iVar3 = 0;
              iVar4 = mdb_del0(txn,1,&mc->mc_dbx->md_name,(MDB_val *)0x0,2);
              if (iVar4 == 0) {
                txn->mt_dbflags[dbi] = '\x02';
                mdb_dbi_close(txn->mt_env,dbi);
              }
              else {
                *(byte *)&txn->mt_flags = (byte)txn->mt_flags | 2;
                iVar3 = iVar4;
              }
            }
          }
          mdb_cursor_close(mc);
        }
      }
    }
    else {
      iVar3 = 0xd;
    }
  }
  return iVar3;
}

Assistant:

int mdb_drop(MDB_txn *txn, MDB_dbi dbi, int del)
{
	MDB_cursor *mc, *m2;
	int rc;

	if ((unsigned)del > 1 || !TXN_DBI_EXIST(txn, dbi, DB_USRVALID))
		return EINVAL;

	if (F_ISSET(txn->mt_flags, MDB_TXN_RDONLY))
		return EACCES;

	if (TXN_DBI_CHANGED(txn, dbi))
		return MDB_BAD_DBI;

	rc = mdb_cursor_open(txn, dbi, &mc);
	if (rc)
		return rc;

	rc = mdb_drop0(mc, mc->mc_db->md_flags & MDB_DUPSORT);
	/* Invalidate the dropped DB's cursors */
	for (m2 = txn->mt_cursors[dbi]; m2; m2 = m2->mc_next)
		m2->mc_flags &= ~(C_INITIALIZED|C_EOF);
	if (rc)
		goto leave;

	/* Can't delete the main DB */
	if (del && dbi >= CORE_DBS) {
		rc = mdb_del0(txn, MAIN_DBI, &mc->mc_dbx->md_name, NULL, F_SUBDATA);
		if (!rc) {
			txn->mt_dbflags[dbi] = DB_STALE;
			mdb_dbi_close(txn->mt_env, dbi);
		} else {
			txn->mt_flags |= MDB_TXN_ERROR;
		}
	} else {
		/* reset the DB record, mark it dirty */
		txn->mt_dbflags[dbi] |= DB_DIRTY;
		txn->mt_dbs[dbi].md_depth = 0;
		txn->mt_dbs[dbi].md_branch_pages = 0;
		txn->mt_dbs[dbi].md_leaf_pages = 0;
		txn->mt_dbs[dbi].md_overflow_pages = 0;
		txn->mt_dbs[dbi].md_entries = 0;
		txn->mt_dbs[dbi].md_root = P_INVALID;

		txn->mt_flags |= MDB_TXN_DIRTY;
	}
leave:
	mdb_cursor_close(mc);
	return rc;
}